

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O0

base_learner * nn_setup(options_i *options,vw *all)

{
  uint64_t uVar1;
  vw *pvVar2;
  long *plVar3;
  byte bVar4;
  pointer pnVar5;
  ostream *poVar6;
  loss_function *plVar7;
  float *pfVar8;
  bool *pbVar9;
  polyprediction *ppVar10;
  learner<nn,_example> *this;
  vw *in_RSI;
  char *pcVar11;
  long *in_RDI;
  learner<nn,_example> *l;
  nn *nv;
  single_learner *base;
  option_group_definition new_options;
  bool meanfield;
  free_ptr<nn> n;
  string *in_stack_fffffffffffff848;
  vw *in_stack_fffffffffffff850;
  string *in_stack_fffffffffffff858;
  _func_void_nn_ptr_learner<char,_example>_ptr_example_ptr *predict;
  single_learner *in_stack_fffffffffffff860;
  learner<char,_example> *in_stack_fffffffffffff868;
  learner<nn,_example> *f;
  single_learner *this_00;
  typed_option<bool> *in_stack_fffffffffffff898;
  option_group_definition *in_stack_fffffffffffff8a0;
  allocator *l_00;
  allocator *nmemb;
  allocator local_5c1;
  string local_5c0 [28];
  float in_stack_fffffffffffffa5c;
  string *in_stack_fffffffffffffa60;
  vw *in_stack_fffffffffffffa68;
  allocator local_571;
  string local_570 [39];
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [199];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  typed_option<bool> local_410;
  allocator local_369;
  string local_368 [39];
  allocator local_341;
  string local_340 [32];
  typed_option<bool> local_320;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [32];
  typed_option<bool> local_230;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  typed_option<unsigned_int> local_140;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [63];
  undefined1 local_29;
  undefined1 local_28 [16];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<nn>();
  local_29 = 0;
  nmemb = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"Neural Network",nmemb);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  l_00 = &local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"nn",l_00);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c2c90);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff858,(uint *)in_stack_fffffffffffff850)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_140,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_188,"Sigmoidal feedforward network with <k> hidden units",&local_189);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff8a0,(typed_option<unsigned_int> *)in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"inpass",&local_251);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c2d77);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  VW::config::typed_option<bool>::keep(&local_230,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"Train or test sigmoidal feedforward network with input passthrough.",
             &local_279);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"multitask",&local_341);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c2e65);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  VW::config::typed_option<bool>::keep(&local_320,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"Share hidden layer across all reduced tasks.",&local_369);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"dropout",&local_431);
  std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c2f53);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  VW::config::typed_option<bool>::keep(&local_410,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_458,"Train or test sigmoidal feedforward network using dropout.",&local_459);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"meanfield",&local_521);
  VW::config::make_option<bool>(in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_548,"Train or test sigmoidal feedforward network using mean field.",&local_549);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator((allocator<char> *)&local_459);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff850);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  (**(code **)*local_10)(local_10,local_68);
  plVar3 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"nn",&local_571);
  bVar4 = (**(code **)(*plVar3 + 8))(plVar3,local_570);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  pvVar2 = local_18;
  if (((bVar4 ^ 0xff) & 1) == 0) {
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3732);
    pnVar5->all = pvVar2;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c374e);
    if (((pnVar5->multitask & 1U) != 0) && ((local_18->quiet & 1U) == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"using multitask sharing for neural network ");
      pcVar11 = "testing";
      if ((local_18->training & 1U) != 0) {
        pcVar11 = "training";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffa68,"meanfield",(allocator *)&stack0xfffffffffffffa67)
    ;
    bVar4 = (**(code **)(*local_10 + 8))(local_10,&stack0xfffffffffffffa68);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffa68);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa67);
    if ((bVar4 & 1) != 0) {
      pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                         ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3877);
      pnVar5->dropout = false;
      if ((local_18->quiet & 1U) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"using mean field for neural network ");
        pcVar11 = "testing";
        if ((local_18->training & 1U) != 0) {
          pcVar11 = "training";
        }
        poVar6 = std::operator<<(poVar6,pcVar11);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c395a);
    if (((pnVar5->dropout & 1U) != 0) && ((local_18->quiet & 1U) == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"using dropout for neural network ");
      pcVar11 = "testing";
      if ((local_18->training & 1U) != 0) {
        pcVar11 = "training";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c39f4);
    if (((pnVar5->inpass & 1U) != 0) && ((local_18->quiet & 1U) == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"using input passthrough for neural network ");
      pcVar11 = "testing";
      if ((local_18->training & 1U) != 0) {
        pcVar11 = "training";
      }
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3a8e);
    pnVar5->finished_setup = false;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_5c0,"squared",&local_5c1);
    plVar7 = getLossFunction(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                             in_stack_fffffffffffffa5c);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3b0c);
    pnVar5->squared_loss = plVar7;
    std::__cxx11::string::~string(local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    uVar1 = local_18->random_seed;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3b50);
    pnVar5->xsubi = uVar1;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3b66);
    uVar1 = pnVar5->xsubi;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3b7c);
    pnVar5->save_xsubi = uVar1;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3b92);
    pfVar8 = calloc_or_throw<float>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3bb7);
    pnVar5->hidden_units = pfVar8;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3bd0);
    pbVar9 = calloc_or_throw<bool>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3bf2);
    pnVar5->dropped_out = pbVar9;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3c08);
    ppVar10 = calloc_or_throw<polyprediction>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3c2a);
    pnVar5->hidden_units_pred = ppVar10;
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3c40);
    ppVar10 = calloc_or_throw<polyprediction>((size_t)nmemb);
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3c5d);
    pnVar5->hiddenbias_pred = ppVar10;
    setup_base((options_i *)in_stack_fffffffffffff858,in_stack_fffffffffffff850);
    in_stack_fffffffffffff860 = LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
    in_stack_fffffffffffff850 = *(vw **)(in_stack_fffffffffffff860 + 0xe0);
    predict = (_func_void_nn_ptr_learner<char,_example>_ptr_example_ptr *)local_28;
    this_00 = in_stack_fffffffffffff860;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::operator->
                       ((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3cc9);
    pnVar5->increment = (size_t)in_stack_fffffffffffff850;
    pnVar5 = std::unique_ptr<nn,_void_(*)(void_*)>::get
                       ((unique_ptr<nn,_void_(*)(void_*)> *)in_stack_fffffffffffff850);
    std::unique_ptr<nn,_void_(*)(void_*)>::operator->((unique_ptr<nn,_void_(*)(void_*)> *)0x2c3cfe);
    this = LEARNER::init_learner<nn,example,LEARNER::learner<char,example>>
                     ((free_ptr<nn> *)this_00,in_stack_fffffffffffff868,
                      (_func_void_nn_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffff860,predict,(size_t)in_stack_fffffffffffff850);
    f = this;
    if ((pnVar5->multitask & 1U) != 0) {
      LEARNER::learner<nn,example>::set_multipredict<LEARNER::learner<char,example>>
                ((learner<nn,example> *)this,multipredict);
    }
    LEARNER::learner<nn,_example>::set_finish
              ((learner<nn,_example> *)this_00,(_func_void_nn_ptr *)f);
    LEARNER::learner<nn,_example>::set_finish_example(this,finish_example);
    LEARNER::learner<nn,_example>::set_end_pass
              ((learner<nn,_example> *)this_00,(_func_void_nn_ptr *)f);
    local_8 = LEARNER::make_base<nn,example>(this);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff850);
  std::unique_ptr<nn,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<nn,_void_(*)(void_*)> *)in_stack_fffffffffffff860);
  return local_8;
}

Assistant:

base_learner* nn_setup(options_i& options, vw& all)
{
  auto n = scoped_calloc_or_throw<nn>();
  bool meanfield = false;
  option_group_definition new_options("Neural Network");
  new_options.add(make_option("nn", n->k).keep().help("Sigmoidal feedforward network with <k> hidden units"))
      .add(make_option("inpass", n->inpass)
               .keep()
               .help("Train or test sigmoidal feedforward network with input passthrough."))
      .add(make_option("multitask", n->multitask).keep().help("Share hidden layer across all reduced tasks."))
      .add(make_option("dropout", n->dropout).keep().help("Train or test sigmoidal feedforward network using dropout."))
      .add(make_option("meanfield", meanfield).help("Train or test sigmoidal feedforward network using mean field."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("nn"))
    return nullptr;

  n->all = &all;

  if (n->multitask && !all.quiet)
    std::cerr << "using multitask sharing for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (options.was_supplied("meanfield"))
  {
    n->dropout = false;
    if (!all.quiet)
      std::cerr << "using mean field for neural network " << (all.training ? "training" : "testing") << std::endl;
  }

  if (n->dropout && !all.quiet)
    std::cerr << "using dropout for neural network " << (all.training ? "training" : "testing") << std::endl;

  if (n->inpass && !all.quiet)
    std::cerr << "using input passthrough for neural network " << (all.training ? "training" : "testing") << std::endl;

  n->finished_setup = false;
  n->squared_loss = getLossFunction(all, "squared", 0);

  n->xsubi = all.random_seed;

  n->save_xsubi = n->xsubi;

  n->hidden_units = calloc_or_throw<float>(n->k);
  n->dropped_out = calloc_or_throw<bool>(n->k);
  n->hidden_units_pred = calloc_or_throw<polyprediction>(n->k);
  n->hiddenbias_pred = calloc_or_throw<polyprediction>(n->k);

  auto base = as_singleline(setup_base(options, all));
  n->increment = base->increment;  // Indexing of output layer is odd.
  nn& nv = *n.get();
  learner<nn, example>& l =
      init_learner(n, base, predict_or_learn_multi<true, true>, predict_or_learn_multi<false, true>, n->k + 1);
  if (nv.multitask)
    l.set_multipredict(multipredict);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_pass(end_pass);

  return make_base(l);
}